

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_State_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Minefield_State_PDU::Decode
          (Minefield_State_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_> *this_00;
  KUINT16 KVar1;
  KException *this_01;
  int iVar2;
  undefined7 in_register_00000011;
  ushort uVar3;
  byte bVar4;
  allocator<char> local_59;
  vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_> *local_58;
  KString local_50;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x47 < iVar2 + (uint)KVar1) {
    std::
    vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
    ::clear(&this->m_vPoints);
    local_58 = &this->m_vMineTypes;
    std::vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>::clear
              (local_58);
    Minefield_Header::Decode(&this->super_Minefield_Header,stream,ignoreHeader);
    KDataStream::Read<unsigned_short>(stream,&(this->m_SeqNumUnion).m_ui16SeqNum);
    KDataStream::Read(stream,&this->m_ui8ForceID);
    KDataStream::Read(stream,&this->m_ui8NumPerimPoints);
    (*(this->m_MinefieldType).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_MinefieldType,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumMineTypes);
    (*(this->m_Loc).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Loc,stream);
    (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Ori,stream);
    (*(this->m_App).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_App,stream);
    KDataStream::Read<unsigned_short>(stream,&(this->m_ui16ProtocolModeUnion).m_ui16ProtocolMode16);
    for (bVar4 = 0; this_00 = local_58, bVar4 < this->m_ui8NumPerimPoints; bVar4 = bVar4 + 1) {
      DATA_TYPE::PerimeterPointCoordinate::PerimeterPointCoordinate
                ((PerimeterPointCoordinate *)&local_50,stream);
      std::
      vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
      ::emplace_back<KDIS::DATA_TYPE::PerimeterPointCoordinate>
                (&this->m_vPoints,(PerimeterPointCoordinate *)&local_50);
      DATA_TYPE::PerimeterPointCoordinate::~PerimeterPointCoordinate
                ((PerimeterPointCoordinate *)&local_50);
    }
    for (uVar3 = 0; uVar3 < this->m_ui16NumMineTypes; uVar3 = uVar3 + 1) {
      DATA_TYPE::EntityType::EntityType((EntityType *)&local_50,stream);
      std::vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>::
      emplace_back<KDIS::DATA_TYPE::EntityType>(this_00,(EntityType *)&local_50);
      DATA_TYPE::DataTypeBase::~DataTypeBase((DataTypeBase *)&local_50);
    }
    return;
  }
  this_01 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Decode",&local_59);
  KException::KException(this_01,&local_50,2);
  __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
}

Assistant:

void Minefield_State_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < MINEFIELD_STATE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vPoints.clear();
    m_vMineTypes.clear();

    Minefield_Header::Decode( stream, ignoreHeader );

    stream >> m_SeqNumUnion.m_ui16SeqNum
           >> m_ui8ForceID
           >> m_ui8NumPerimPoints
           >> KDIS_STREAM m_MinefieldType
           >> m_ui16NumMineTypes
           >> KDIS_STREAM m_Loc
           >> KDIS_STREAM m_Ori
           >> KDIS_STREAM m_App
           >> m_ui16ProtocolModeUnion.m_ui16ProtocolMode16;

    for( KUINT8 i = 0; i < m_ui8NumPerimPoints; ++i )
    {
        m_vPoints.push_back( PerimeterPointCoordinate( stream ) );
    }

    for( KUINT16 j = 0; j < m_ui16NumMineTypes; ++j )
    {
        m_vMineTypes.push_back( EntityType( stream ) );
    }
}